

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::doAddCol(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,LPColBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *col,bool scale)

{
  pointer pnVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  undefined7 in_register_00000011;
  long lVar8;
  int iVar9;
  pointer pnVar10;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pLVar11;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar12;
  soplex *psVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  cpp_dec_float<200U,_int,_void> *pcVar15;
  long in_FS_OFFSET;
  byte bVar16;
  int idx;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  empty;
  int local_48c;
  uint local_488;
  undefined4 local_484;
  Item *local_480;
  int local_474;
  DataKey local_470;
  double local_468;
  undefined8 uStack_460;
  LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  local_458;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  soplex local_230 [112];
  int local_1c0;
  undefined1 local_1bc;
  undefined8 local_1b8;
  soplex local_1b0 [112];
  int local_140;
  undefined1 local_13c;
  undefined8 local_138;
  soplex local_130 [112];
  int local_c0;
  undefined1 local_bc;
  undefined8 local_b8;
  soplex local_b0 [112];
  int local_40;
  undefined1 local_3c;
  undefined8 local_38;
  
  bVar16 = 0;
  local_484 = (undefined4)CONCAT71(in_register_00000011,scale);
  local_48c = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_474 = (this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum;
  local_458.left.m_backend.data._M_elems[0] = 0;
  local_458.left.m_backend.data._M_elems[1] = 0xffffffff;
  LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::add(&this->
         super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ,(DataKey *)&local_458,col);
  if (this->thesense != MAXIMIZE) {
    local_458.left.m_backend.data._M_elems[0] = 0xffffffff;
    boost::multiprecision::
    number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
    ::operator*=((number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  *)((this->
                     super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).object.val.
                     super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + local_48c),(int *)&local_458);
  }
  local_480 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[local_48c].idx;
  local_488 = 0;
  if ((char)local_484 != '\0') {
    local_488 = (*this->lp_scaler->_vptr_SPxScaler[1])
                          (this->lp_scaler,local_480,
                           &(this->
                            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            ).scaleExp);
    pcVar15 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_48c].m_backend;
    ::soplex::infinity::__tls_init();
    local_468 = *(double *)(in_FS_OFFSET + -8);
    local_458.left.m_backend.fpclass = cpp_dec_float_finite;
    local_458.left.m_backend.prec_elem = 0x1c;
    local_458.left.m_backend.data._M_elems[0] = 0;
    local_458.left.m_backend.data._M_elems[1] = 0;
    local_458.left.m_backend.data._M_elems[2] = 0;
    local_458.left.m_backend.data._M_elems[3] = 0;
    local_458.left.m_backend.data._M_elems[4] = 0;
    local_458.left.m_backend.data._M_elems[5] = 0;
    local_458.left.m_backend.data._M_elems[6] = 0;
    local_458.left.m_backend.data._M_elems[7] = 0;
    local_458.left.m_backend.data._M_elems[8] = 0;
    local_458.left.m_backend.data._M_elems[9] = 0;
    local_458.left.m_backend.data._M_elems[10] = 0;
    local_458.left.m_backend.data._M_elems[0xb] = 0;
    local_458.left.m_backend.data._M_elems[0xc] = 0;
    local_458.left.m_backend.data._M_elems[0xd] = 0;
    local_458.left.m_backend.data._M_elems[0xe] = 0;
    local_458.left.m_backend.data._M_elems[0xf] = 0;
    local_458.left.m_backend.data._M_elems[0x10] = 0;
    local_458.left.m_backend.data._M_elems[0x11] = 0;
    local_458.left.m_backend.data._M_elems[0x12] = 0;
    local_458.left.m_backend.data._M_elems[0x13] = 0;
    local_458.left.m_backend.data._M_elems[0x14] = 0;
    local_458.left.m_backend.data._M_elems[0x15] = 0;
    local_458.left.m_backend.data._M_elems[0x16] = 0;
    local_458.left.m_backend.data._M_elems[0x17] = 0;
    local_458.left.m_backend.data._M_elems[0x18] = 0;
    local_458.left.m_backend.data._M_elems[0x19] = 0;
    local_458.left.m_backend.data._M_elems._104_5_ = 0;
    local_458.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_458.left.m_backend.exp = 0;
    local_458.left.m_backend.neg = false;
    uStack_460 = 0;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_458,local_468);
    if (((pcVar15->fpclass != cpp_dec_float_NaN) &&
        (local_458.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar15,(cpp_dec_float<200U,_int,_void> *)&local_458), iVar5 < 0)) {
      lVar8 = (long)local_48c;
      pnVar1 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = pnVar1 + lVar8;
      psVar13 = local_b0;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)psVar13 = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
        psVar13 = psVar13 + (ulong)bVar16 * -8 + 4;
      }
      local_40 = pnVar1[lVar8].m_backend.exp;
      local_3c = pnVar1[lVar8].m_backend.neg;
      local_38._0_4_ = pnVar1[lVar8].m_backend.fpclass;
      local_38._4_4_ = pnVar1[lVar8].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_458,local_b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_488,(undefined4)local_38);
      lVar6 = (long)local_48c;
      pnVar1 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).up.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar11 = &local_458;
      pnVar10 = pnVar1 + lVar6;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pLVar11->left).m_backend.data._M_elems[0];
        pLVar11 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      pnVar1[lVar6].m_backend.exp = local_458.left.m_backend.exp;
      pnVar1[lVar6].m_backend.neg = local_458.left.m_backend.neg;
      pnVar1[lVar6].m_backend.fpclass = local_458.left.m_backend.fpclass;
      pnVar1[lVar6].m_backend.prec_elem = local_458.left.m_backend.prec_elem;
    }
    pcVar15 = &(this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start[local_48c].m_backend;
    ::soplex::infinity::__tls_init();
    local_458.left.m_backend.fpclass = cpp_dec_float_finite;
    local_458.left.m_backend.prec_elem = 0x1c;
    local_458.left.m_backend.data._M_elems[0] = 0;
    local_458.left.m_backend.data._M_elems[1] = 0;
    local_458.left.m_backend.data._M_elems[2] = 0;
    local_458.left.m_backend.data._M_elems[3] = 0;
    local_458.left.m_backend.data._M_elems[4] = 0;
    local_458.left.m_backend.data._M_elems[5] = 0;
    local_458.left.m_backend.data._M_elems[6] = 0;
    local_458.left.m_backend.data._M_elems[7] = 0;
    local_458.left.m_backend.data._M_elems[8] = 0;
    local_458.left.m_backend.data._M_elems[9] = 0;
    local_458.left.m_backend.data._M_elems[10] = 0;
    local_458.left.m_backend.data._M_elems[0xb] = 0;
    local_458.left.m_backend.data._M_elems[0xc] = 0;
    local_458.left.m_backend.data._M_elems[0xd] = 0;
    local_458.left.m_backend.data._M_elems[0xe] = 0;
    local_458.left.m_backend.data._M_elems[0xf] = 0;
    local_458.left.m_backend.data._M_elems[0x10] = 0;
    local_458.left.m_backend.data._M_elems[0x11] = 0;
    local_458.left.m_backend.data._M_elems[0x12] = 0;
    local_458.left.m_backend.data._M_elems[0x13] = 0;
    local_458.left.m_backend.data._M_elems[0x14] = 0;
    local_458.left.m_backend.data._M_elems[0x15] = 0;
    local_458.left.m_backend.data._M_elems[0x16] = 0;
    local_458.left.m_backend.data._M_elems[0x17] = 0;
    local_458.left.m_backend.data._M_elems[0x18] = 0;
    local_458.left.m_backend.data._M_elems[0x19] = 0;
    local_458.left.m_backend.data._M_elems._104_5_ = 0;
    local_458.left.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    local_458.left.m_backend.exp = 0;
    local_458.left.m_backend.neg = false;
    boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
              ((cpp_dec_float<200u,int,void> *)&local_458,-local_468);
    if (((pcVar15->fpclass != cpp_dec_float_NaN) &&
        (local_458.left.m_backend.fpclass != cpp_dec_float_NaN)) &&
       (iVar5 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                          (pcVar15,(cpp_dec_float<200U,_int,_void> *)&local_458), 0 < iVar5)) {
      lVar8 = (long)local_48c;
      pnVar1 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = pnVar1 + lVar8;
      psVar13 = local_130;
      for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
        *(undefined4 *)psVar13 = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
        psVar13 = psVar13 + (ulong)bVar16 * -8 + 4;
      }
      local_c0 = pnVar1[lVar8].m_backend.exp;
      local_bc = pnVar1[lVar8].m_backend.neg;
      local_b8._0_4_ = pnVar1[lVar8].m_backend.fpclass;
      local_b8._4_4_ = pnVar1[lVar8].m_backend.prec_elem;
      spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                  *)&local_458,local_130,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)(ulong)-local_488,(undefined4)local_b8);
      lVar6 = (long)local_48c;
      pnVar1 = (this->
               super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).low.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar11 = &local_458;
      pnVar10 = pnVar1 + lVar6;
      for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
        (pnVar10->m_backend).data._M_elems[0] = (pLVar11->left).m_backend.data._M_elems[0];
        pLVar11 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pLVar11 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      pnVar1[lVar6].m_backend.exp = local_458.left.m_backend.exp;
      pnVar1[lVar6].m_backend.neg = local_458.left.m_backend.neg;
      pnVar1[lVar6].m_backend.fpclass = local_458.left.m_backend.fpclass;
      pnVar1[lVar6].m_backend.prec_elem = local_458.left.m_backend.prec_elem;
    }
    uVar4 = local_488;
    lVar8 = (long)local_48c;
    pnVar1 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar10 = pnVar1 + lVar8;
    psVar13 = local_1b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      *(undefined4 *)psVar13 = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
      psVar13 = psVar13 + (ulong)bVar16 * -8 + 4;
    }
    local_140 = pnVar1[lVar8].m_backend.exp;
    local_13c = pnVar1[lVar8].m_backend.neg;
    local_138._0_4_ = pnVar1[lVar8].m_backend.fpclass;
    local_138._4_4_ = pnVar1[lVar8].m_backend.prec_elem;
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_458,local_1b0,
               (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)local_488,(undefined4)local_138);
    lVar6 = (long)local_48c;
    pnVar1 = (this->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).object.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pLVar11 = &local_458;
    pnVar10 = pnVar1 + lVar6;
    for (lVar8 = 0x1c; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pnVar10->m_backend).data._M_elems[0] = (pLVar11->left).m_backend.data._M_elems[0];
      pLVar11 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)((long)pLVar11 + ((ulong)bVar16 * -2 + 1) * 4);
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar16 * -2 + 1) * 4);
    }
    pnVar1[lVar6].m_backend.exp = local_458.left.m_backend.exp;
    pnVar1[lVar6].m_backend.neg = local_458.left.m_backend.neg;
    pnVar1[lVar6].m_backend.fpclass = local_458.left.m_backend.fpclass;
    pnVar1[lVar6].m_backend.prec_elem = local_458.left.m_backend.prec_elem;
    (this->
    super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).scaleExp.data[local_48c] = uVar4;
  }
  lVar6 = (long)(local_480->data).
                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .memused;
  if (0 < lVar6) {
    do {
      lVar8 = lVar6 + -1;
      iVar5 = (local_480->data).
              super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .m_elem[lVar6 + -1].idx;
      if ((char)local_484 != '\0') {
        pNVar2 = (local_480->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pNVar12 = pNVar2 + lVar8;
        psVar13 = local_230;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          *(undefined4 *)psVar13 = (pNVar12->val).m_backend.data._M_elems[0];
          pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar12 + ((ulong)bVar16 * -2 + 1) * 4);
          psVar13 = psVar13 + (ulong)bVar16 * -8 + 4;
        }
        local_1c0 = pNVar2[lVar8].val.m_backend.exp;
        local_1bc = pNVar2[lVar8].val.m_backend.neg;
        local_1b8._0_4_ = pNVar2[lVar8].val.m_backend.fpclass;
        local_1b8._4_4_ = pNVar2[lVar8].val.m_backend.prec_elem;
        spxLdexp<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>
                  ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                    *)&local_458,local_230,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)(ulong)((this->
                              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).scaleExp.data[iVar5] + local_488),
                   CONCAT31((int3)((uint)local_1c0 >> 8),local_1bc));
        pNVar2 = (local_480->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        pLVar11 = &local_458;
        pNVar12 = pNVar2 + lVar8;
        for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pNVar12->val).m_backend.data._M_elems[0] = (pLVar11->left).m_backend.data._M_elems[0];
          pLVar11 = (LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pLVar11 + (ulong)bVar16 * -8 + 4);
          pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        }
        pNVar2[lVar8].val.m_backend.exp = local_458.left.m_backend.exp;
        pNVar2[lVar8].val.m_backend.neg = local_458.left.m_backend.neg;
        pNVar2[lVar8].val.m_backend.fpclass = local_458.left.m_backend.fpclass;
        pNVar2[lVar8].val.m_backend.prec_elem = local_458.left.m_backend.prec_elem;
      }
      pNVar2 = (local_480->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .m_elem;
      pNVar12 = pNVar2 + lVar8;
      pnVar14 = &local_2b0;
      for (lVar7 = 0x1c; lVar7 != 0; lVar7 = lVar7 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pNVar12->val).m_backend.data._M_elems[0];
        pNVar12 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)((long)pNVar12 + ((ulong)bVar16 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar16 * -2 + 1) * 4);
      }
      local_2b0.m_backend.exp = pNVar2[lVar8].val.m_backend.exp;
      local_2b0.m_backend.neg = pNVar2[lVar8].val.m_backend.neg;
      local_2b0.m_backend.fpclass = pNVar2[lVar8].val.m_backend.fpclass;
      local_2b0.m_backend.prec_elem = pNVar2[lVar8].val.m_backend.prec_elem;
      if ((this->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .set.thenum <= iVar5) {
        LPRowBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::LPRowBase(&local_458,0);
        iVar9 = (this->
                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thenum;
        if (iVar9 <= iVar5) {
          iVar9 = (iVar5 - iVar9) + 1;
          do {
            local_470.info = 0;
            local_470.idx = -1;
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::add(&this->
                   super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ,&local_470,&local_458);
            iVar9 = iVar9 + -1;
          } while (iVar9 != 0);
        }
        local_458.vec._vptr_DSVectorBase = (_func_int **)&PTR__DSVectorBase_006b38e0;
        if (local_458.vec.theelem !=
            (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *)0x0) {
          free(local_458.vec.theelem);
          local_458.vec.theelem =
               (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *)0x0;
        }
      }
      LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add2(&this->
              super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ,iVar5,1,&local_48c,&local_2b0);
      bVar3 = 1 < lVar6;
      lVar6 = lVar8;
    } while (bVar3);
  }
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x51])(this,1);
  (*(this->
    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).
    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    .
    super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
    ._vptr_ClassArray[0x50])
            (this,(ulong)(uint)((this->
                                super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                ).
                                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .set.thenum - local_474));
  return;
}

Assistant:

void doAddCol(const LPColBase<R>& col, bool scale = false)
   {
      int idx = nCols();
      int oldRowNumber = nRows();
      int newColScaleExp = 0;

      LPColSetBase<R>::add(col);

      if(thesense != MAXIMIZE)
         LPColSetBase<R>::maxObj_w(idx) *= -1;

      SVectorBase<R>& vec = colVector_w(idx);

      DataArray <int>& rowscaleExp = LPRowSetBase<R>::scaleExp;

      // compute new column scaling factor and apply it to the bounds
      if(scale)
      {
         newColScaleExp = lp_scaler->computeScaleExp(vec, rowscaleExp);

         if(upper(idx) < R(infinity))
            upper_w(idx) = spxLdexp(upper_w(idx), - newColScaleExp);

         if(lower(idx) > R(-infinity))
            lower_w(idx) = spxLdexp(lower_w(idx), - newColScaleExp);

         maxObj_w(idx) = spxLdexp(maxObj_w(idx), newColScaleExp);

         LPColSetBase<R>::scaleExp[idx] = newColScaleExp;
      }

      // now insert nonzeros to row file also
      for(int j = vec.size() - 1; j >= 0; --j)
      {
         int i = vec.index(j);

         // apply new column and existing row scaling factors to new values in ColSet
         if(scale)
            vec.value(j) = spxLdexp(vec.value(j), newColScaleExp + rowscaleExp[i]);

         R val = vec.value(j);

         // create new rows if required
         if(i >= nRows())
         {
            LPRowBase<R> empty;

            for(int k = nRows(); k <= i; ++k)
               LPRowSetBase<R>::add(empty);
         }

         assert(i < nRows());
         LPRowSetBase<R>::add2(i, 1, &idx, &val);
      }

      addedCols(1);
      addedRows(nRows() - oldRowNumber);
   }